

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall gl4cts::AdvancedUsageSwitchPrograms::Run(AdvancedUsageSwitchPrograms *this)

{
  bool bVar1;
  GLuint GVar2;
  size_type sVar3;
  reference data;
  int local_c0;
  uint local_bc;
  int i_3;
  GLuint i_2;
  int s;
  vector<unsigned_int,_std::allocator<unsigned_int>_> init_data;
  char *pcStack_90;
  int i_1;
  char *xfb_var;
  char *src_fs;
  char *src_vs;
  undefined1 local_68 [8];
  string fs_str;
  string vs_str;
  int i;
  GLint p3;
  GLint p2;
  GLint p1;
  AdvancedUsageSwitchPrograms *this_local;
  
  _p2 = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92cc,&p3);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92d2,&i);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92d0,(GLint *)(vs_str.field_2._M_local_buf + 0xc));
  if (((7 < p3) && (0 < i)) && (7 < (int)vs_str.field_2._12_4_)) {
    for (vs_str.field_2._8_4_ = 0; (int)vs_str.field_2._8_4_ < 8;
        vs_str.field_2._8_4_ = vs_str.field_2._8_4_ + 1) {
      GenVSSrc_abi_cxx11_((string *)((long)&fs_str.field_2 + 8),this,vs_str.field_2._8_4_,
                          vs_str.field_2._8_4_ << 3);
      GenFSSrc_abi_cxx11_((string *)local_68,this,7 - vs_str.field_2._8_4_,
                          vs_str.field_2._8_4_ * 0x10 + 0x80);
      src_fs = (char *)std::__cxx11::string::c_str();
      xfb_var = (char *)std::__cxx11::string::c_str();
      GVar2 = gl4cts::anon_unknown_0::SACSubcaseBase::CreateProgram
                        (&this->super_SACSubcaseBase,src_fs,(char *)0x0,(char *)0x0,(char *)0x0,
                         xfb_var,false);
      this->prog_[(int)vs_str.field_2._8_4_] = GVar2;
      pcStack_90 = "o_atomic_value";
      glu::CallLogWrapper::glTransformFeedbackVaryings
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->prog_[(int)vs_str.field_2._8_4_],1,
                 &stack0xffffffffffffff70,0x8c8d);
      gl4cts::anon_unknown_0::SACSubcaseBase::LinkProgram
                (&this->super_SACSubcaseBase,this->prog_[(int)vs_str.field_2._8_4_]);
      std::__cxx11::string::~string((string *)local_68);
      std::__cxx11::string::~string((string *)(fs_str.field_2._M_local_buf + 8));
    }
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               8,this->counter_buffer_);
    for (init_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        init_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ < 8;
        init_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             init_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i_2 + 3));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&s,0x100,
                 (allocator<unsigned_int> *)((long)&i_2 + 3));
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i_2 + 3));
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,
                 this->counter_buffer_
                 [init_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_]);
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&s);
      data = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&s,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,sVar3 << 2,data,0x88ea);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&s);
    }
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,0);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               1,&this->xfb_buffer_);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,this->xfb_buffer_);
    glu::CallLogWrapper::glBufferData
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,1000,(void *)0x0,0x88e2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,0);
    glu::CallLogWrapper::glGenTextures
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               1,&this->rt_);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0xde1,this->rt_);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0xde1,0,0x8236,8,8,0,0x8d94,0x1405,(void *)0x0);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0xde1,0);
    glu::CallLogWrapper::glGenFramebuffers
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               1,&this->fbo_);
    glu::CallLogWrapper::glBindFramebuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8d40,this->fbo_);
    glu::CallLogWrapper::glFramebufferTexture
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8d40,0x8ce0,this->rt_,0);
    glu::CallLogWrapper::glBindFramebuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8d40,0);
    gl4cts::anon_unknown_0::SACSubcaseBase::CreateTriangle
              (&this->super_SACSubcaseBase,&this->vao_,&this->vbo_,(GLuint *)0x0);
    for (local_bc = 0; local_bc < 8; local_bc = local_bc + 1) {
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,local_bc,this->counter_buffer_[local_bc]);
    }
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,0,this->xfb_buffer_);
    glu::CallLogWrapper::glBindFramebuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8d40,this->fbo_);
    glu::CallLogWrapper::glViewport
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0,0,8,8);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               this->vao_);
    for (local_c0 = 0; local_c0 < 8; local_c0 = local_c0 + 1) {
      glu::CallLogWrapper::glUseProgram
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->prog_[local_c0]);
      glu::CallLogWrapper::glBeginTransformFeedback
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,4);
      glu::CallLogWrapper::glDrawArrays
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,4,0,3);
      glu::CallLogWrapper::glEndTransformFeedback
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                        (&this->super_SACSubcaseBase,this->counter_buffer_[local_c0],
                         (long)(local_c0 << 3),3);
      if (!bVar1) {
        return (long)&DAT_ffffffffffffffff;
      }
      bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                        (&this->super_SACSubcaseBase,this->counter_buffer_[7 - local_c0],
                         (long)(local_c0 * 0x10 + 0x80),0x40);
      if (!bVar1) {
        return (long)&DAT_ffffffffffffffff;
      }
    }
  }
  return 0;
}

Assistant:

virtual long Run()
	{

		GLint p1, p2, p3;
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS, &p1);
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTERS, &p2);
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS, &p3);
		if (p1 < 8 || p2 < 1 || p3 < 8)
		{
			return NO_ERROR;
		}

		// create programs
		for (int i = 0; i < 8; ++i)
		{
			std::string vs_str  = GenVSSrc(i, i * 8);
			std::string fs_str  = GenFSSrc(7 - i, 128 + i * 16);
			const char* src_vs  = vs_str.c_str();
			const char* src_fs  = fs_str.c_str();
			prog_[i]			= CreateProgram(src_vs, NULL, NULL, NULL, src_fs, false);
			const char* xfb_var = "o_atomic_value";
			glTransformFeedbackVaryings(prog_[i], 1, &xfb_var, GL_SEPARATE_ATTRIBS);
			LinkProgram(prog_[i]);
		}

		// create atomic counter buffers
		glGenBuffers(8, counter_buffer_);
		for (int i = 0; i < 8; ++i)
		{
			std::vector<GLuint> init_data(256);
			glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_[i]);
			glBufferData(GL_ATOMIC_COUNTER_BUFFER, (GLsizeiptr)(init_data.size() * sizeof(GLuint)), &init_data[0],
						 GL_DYNAMIC_COPY);
		}
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// create transform feedback buffer
		glGenBuffers(1, &xfb_buffer_);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 1000, NULL, GL_STREAM_COPY);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		// create render target
		const int s = 8;
		glGenTextures(1, &rt_);
		glBindTexture(GL_TEXTURE_2D, rt_);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_R32UI, s, s, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, NULL);
		glBindTexture(GL_TEXTURE_2D, 0);

		// create fbo
		glGenFramebuffers(1, &fbo_);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, rt_, 0);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		// create geometry
		CreateTriangle(&vao_, &vbo_, NULL);

		// draw
		for (GLuint i = 0; i < 8; ++i)
		{
			glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, i, counter_buffer_[i]);
		}
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, xfb_buffer_);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glViewport(0, 0, s, s);
		glBindVertexArray(vao_);

		for (int i = 0; i < 8; ++i)
		{
			glUseProgram(prog_[i]);
			glBeginTransformFeedback(GL_TRIANGLES);
			glDrawArrays(GL_TRIANGLES, 0, 3);
			glEndTransformFeedback();
			glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

			if (!CheckFinalCounterValue(counter_buffer_[i], i * 8, 3))
				return ERROR;
			if (!CheckFinalCounterValue(counter_buffer_[7 - i], 128 + i * 16, 64))
				return ERROR;
		}
		return NO_ERROR;
	}